

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O3

int P_Thing_Warp(AActor *caller,AActor *reference,double xofs,double yofs,double zofs,DAngle *angle,
                int flags,double heightoffset,double radiusoffset,DAngle *pitch)

{
  FDisplacement *pFVar1;
  double dVar2;
  int iVar3;
  undefined1 auVar4 [16];
  double x;
  double y;
  bool bVar5;
  int iVar6;
  AActor *pAVar7;
  AActor *this;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  double dVar12;
  double dVar13;
  double z;
  double dVar14;
  double dVar15;
  DVector2 v;
  DVector2 local_58;
  DAngle local_40;
  DAngle local_38;
  
  this = reference;
  if (((uint)flags >> 0xc & 1) == 0) {
    this = caller;
    caller = reference;
  }
  x = (this->__Pos).X;
  y = (this->__Pos).Y;
  dVar2 = (this->__Pos).Z;
  iVar3 = this->Sector->PortalGroup;
  dVar15 = caller->Height;
  dVar13 = angle->Degrees;
  if ((flags & 2U) == 0) {
    pAVar7 = this;
    if ((flags & 4U) == 0) {
      pAVar7 = caller;
    }
    dVar13 = dVar13 + (pAVar7->Angles).Yaw.Degrees;
    angle->Degrees = dVar13;
  }
  z = heightoffset * dVar15 + zofs;
  dVar14 = radiusoffset * caller->radius;
  dVar15 = FFastTrig::sin(&fasttrig,dVar13 * 11930464.711111112 + 6755399441055744.0);
  dVar13 = FFastTrig::cos(&fasttrig,angle->Degrees * 11930464.711111112 + 6755399441055744.0);
  if (((uint)flags >> 10 & 1) == 0) {
    if ((flags & 1U) == 0) {
      dVar12 = dVar15 * yofs;
      yofs = xofs * dVar15 - yofs * dVar13;
      xofs = dVar12 + dVar13 * xofs;
    }
    dVar13 = dVar13 * dVar14 + xofs;
    dVar15 = dVar15 * dVar14 + yofs;
    if (((uint)flags >> 8 & 1) == 0) {
      P_GetOffsetPosition((caller->__Pos).X,(caller->__Pos).Y,dVar13,dVar15);
      AActor::SetOrigin(this,local_58.X,local_58.Y,z + (caller->__Pos).Z,true);
    }
    else {
      P_GetOffsetPosition((caller->__Pos).X,(caller->__Pos).Y,dVar13,dVar15);
      AActor::SetOrigin(this,local_58.X,local_58.Y,(caller->__Pos).Z + 0.0,true);
LAB_0045c2a0:
      (this->__Pos).Z = z + this->floorz;
    }
  }
  else {
    AActor::SetOrigin(this,dVar13 * dVar14 + xofs,dVar15 * dVar14 + yofs,z,true);
    if (((uint)flags >> 8 & 1) != 0) goto LAB_0045c2a0;
  }
  if (((flags & 8U) == 0) && (bVar5 = P_TestMobjLocation(this), !bVar5)) {
    AActor::SetOrigin(this,x,y,dVar2,true);
    return 0;
  }
  if (((uint)flags >> 9 & 1) != 0) {
    AActor::SetOrigin(this,x,y,dVar2,true);
    return 1;
  }
  (this->Angles).Yaw.Degrees = angle->Degrees;
  if ((short)flags < 0) {
    local_38.Degrees = (caller->Angles).Pitch.Degrees;
    AActor::SetPitch(this,&local_38,false,false);
  }
  dVar15 = pitch->Degrees;
  if ((dVar15 != 0.0) || (NAN(dVar15))) {
    local_40.Degrees = dVar15 + (this->Angles).Pitch.Degrees;
    AActor::SetPitch(this,&local_40,false,false);
  }
  if (((uint)flags >> 0xe & 1) != 0) {
    (this->Vel).Z = (caller->Vel).Z;
    dVar15 = (caller->Vel).Y;
    (this->Vel).X = (caller->Vel).X;
    (this->Vel).Y = dVar15;
  }
  if ((char)flags < '\0') {
    (this->Vel).X = 0.0;
    (this->Vel).Y = 0.0;
    (this->Vel).Z = 0.0;
  }
  if ((flags & 0x20U) == 0) {
    if ((flags & 0x40U) == 0) {
      if ((flags & 0x10U) != 0) goto LAB_0045c567;
      (this->Prev).Z = (this->__Pos).Z;
      dVar2 = (this->__Pos).Y;
      (this->Prev).X = (this->__Pos).X;
      (this->Prev).Y = dVar2;
      (this->PrevAngles).Roll.Degrees = (this->Angles).Roll.Degrees;
      dVar2 = (this->Angles).Yaw.Degrees;
      (this->PrevAngles).Pitch.Degrees = (this->Angles).Pitch.Degrees;
      (this->PrevAngles).Yaw.Degrees = dVar2;
      if (this->Sector == (sector_t *)0x0) {
        iVar6 = 0;
      }
      else {
        iVar6 = this->Sector->PortalGroup;
      }
    }
    else {
      iVar6 = this->Sector->PortalGroup;
      dVar15 = 0.0;
      dVar13 = 0.0;
      uVar8 = 0;
      uVar9 = 0;
      uVar10 = 0;
      uVar11 = 0;
      if (caller->PrevPortalGroup != iVar6) {
        pFVar1 = Displacements.data.Array + (Displacements.size * iVar6 + caller->PrevPortalGroup);
        uVar8 = *(undefined4 *)&(pFVar1->pos).X;
        uVar9 = *(undefined4 *)((long)&(pFVar1->pos).X + 4);
        uVar10 = *(undefined4 *)&(pFVar1->pos).Y;
        uVar11 = *(undefined4 *)((long)&(pFVar1->pos).Y + 4);
      }
      iVar3 = caller->Sector->PortalGroup;
      if (iVar3 != iVar6) {
        dVar15 = Displacements.data.Array[Displacements.size * iVar6 + iVar3].pos.X;
        dVar13 = Displacements.data.Array[Displacements.size * iVar6 + iVar3].pos.Y;
      }
      (this->Prev).Z = ((this->__Pos).Z + dVar2) - dVar2;
      dVar2 = ((double)CONCAT44(uVar9,uVar8) + x + (this->__Pos).X) - (x + dVar15);
      dVar15 = ((double)CONCAT44(uVar11,uVar10) + y + (this->__Pos).Y) - (y + dVar13);
      auVar4._8_4_ = SUB84(dVar15,0);
      auVar4._0_8_ = dVar2;
      auVar4._12_4_ = (int)((ulong)dVar15 >> 0x20);
      (this->Prev).X = dVar2;
      (this->Prev).Y = (double)auVar4._8_8_;
    }
  }
  else {
    iVar6 = this->Sector->PortalGroup;
    uVar8 = 0;
    uVar9 = 0;
    uVar10 = 0;
    uVar11 = 0;
    if (iVar3 != iVar6) {
      pFVar1 = Displacements.data.Array + (Displacements.size * iVar6 + iVar3);
      uVar8 = *(undefined4 *)&(pFVar1->pos).X;
      uVar9 = *(undefined4 *)((long)&(pFVar1->pos).X + 4);
      uVar10 = *(undefined4 *)&(pFVar1->pos).Y;
      uVar11 = *(undefined4 *)((long)&(pFVar1->pos).Y + 4);
    }
    dVar15 = (this->__Pos).Z;
    dVar13 = (this->__Pos).Y;
    (this->Prev).X = (this->Prev).X + ((this->__Pos).X - (x + (double)CONCAT44(uVar9,uVar8)));
    (this->Prev).Y = (this->Prev).Y + (dVar13 - (y + (double)CONCAT44(uVar11,uVar10)));
    (this->Prev).Z = (dVar15 - dVar2) + (this->Prev).Z;
  }
  this->PrevPortalGroup = iVar6;
LAB_0045c567:
  if ((((uint)flags >> 0xb & 1) != 0) && (((caller->flags2).Value & 0x80000) != 0)) {
    dVar2 = AActor::GetBobOffset(caller,0.0);
    (this->__Pos).Z = dVar2 + (this->__Pos).Z;
  }
  local_58.X = (this->__Pos).X;
  local_58.Y = (this->__Pos).Y;
  P_TryMove(this,&local_58,0,(secplane_t *)0x0);
  return 1;
}

Assistant:

int P_Thing_Warp(AActor *caller, AActor *reference, double xofs, double yofs, double zofs, DAngle angle, int flags, double heightoffset, double radiusoffset, DAngle pitch)
{
	if (flags & WARPF_MOVEPTR)
	{
		AActor *temp = reference;
		reference = caller;
		caller = temp;
	}

	DVector3 old = caller->Pos();
	int oldpgroup = caller->Sector->PortalGroup;

	zofs += reference->Height * heightoffset;
	

	if (!(flags & WARPF_ABSOLUTEANGLE))
	{
		angle += (flags & WARPF_USECALLERANGLE) ? caller->Angles.Yaw: reference->Angles.Yaw;
	}

	const double rad = radiusoffset * reference->radius;
	const double s = angle.Sin();
	const double c = angle.Cos();

	if (!(flags & WARPF_ABSOLUTEPOSITION))
	{
		if (!(flags & WARPF_ABSOLUTEOFFSET))
		{
			double xofs1 = xofs;

			// (borrowed from A_SpawnItemEx, assumed workable)
			// in relative mode negative y values mean 'left' and positive ones mean 'right'
			// This is the inverse orientation of the absolute mode!
			
			xofs = xofs1 * c + yofs * s;
			yofs = xofs1 * s - yofs * c;
		}

		if (flags & WARPF_TOFLOOR)
		{
			// set correct xy
			// now the caller's floorz should be appropriate for the assigned xy-position
			// assigning position again with.
			// extra unlink, link and environment calculation
			caller->SetOrigin(reference->Vec3Offset(xofs + rad * c, yofs + rad * s, 0.), true);
			// The two-step process is important.
			caller->SetZ(caller->floorz + zofs);
		}
		else
		{
			caller->SetOrigin(reference->Vec3Offset(xofs + rad * c, yofs + rad * s, zofs), true);
		}
	}
	else // [MC] The idea behind "absolute" is meant to be "absolute". Override everything, just like A_SpawnItemEx's.
	{
		caller->SetOrigin(xofs + rad * c, yofs + rad * s, zofs, true);
		if (flags & WARPF_TOFLOOR)
		{
			caller->SetZ(caller->floorz + zofs);
		}
	}

	if ((flags & WARPF_NOCHECKPOSITION) || P_TestMobjLocation(caller))
	{
		if (flags & WARPF_TESTONLY)
		{
			caller->SetOrigin(old, true);
		}
		else
		{
			caller->Angles.Yaw = angle;

			if (flags & WARPF_COPYPITCH)
				caller->SetPitch(reference->Angles.Pitch, false);
			
			if (pitch != 0)
				caller->SetPitch(caller->Angles.Pitch + pitch, false);
			
			if (flags & WARPF_COPYVELOCITY)
			{
				caller->Vel = reference->Vel;
			}
			if (flags & WARPF_STOP)
			{
				caller->Vel.Zero();
			}

			// this is no fun with line portals 
			if (flags & WARPF_WARPINTERPOLATION)
			{
				// This just translates the movement but doesn't change the vector
				DVector3 displacedold  = old + Displacements.getOffset(oldpgroup, caller->Sector->PortalGroup);
				caller->Prev += caller->Pos() - displacedold;
				caller->PrevPortalGroup = caller->Sector->PortalGroup;
			}
			else if (flags & WARPF_COPYINTERPOLATION)
			{
				// Map both positions of the reference actor to the current portal group
				DVector3 displacedold = old + Displacements.getOffset(reference->PrevPortalGroup, caller->Sector->PortalGroup);
				DVector3 displacedref = old + Displacements.getOffset(reference->Sector->PortalGroup, caller->Sector->PortalGroup);
				caller->Prev = caller->Pos() + displacedold - displacedref;
				caller->PrevPortalGroup = caller->Sector->PortalGroup;
			}
			else if (!(flags & WARPF_INTERPOLATE))
			{
				caller->ClearInterpolation();
			}

			if ((flags & WARPF_BOB) && (reference->flags2 & MF2_FLOATBOB))
			{
				caller->AddZ(reference->GetBobOffset());
			}
			P_TryMove(caller, caller->Pos(), false);
		}
		return true;
	}
	caller->SetOrigin(old, true);
	return false;
}